

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

bool chaiscript::Name_Validator::is_reserved_word<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  initializer_list<unsigned_int> __l;
  int iVar1;
  size_type sVar2;
  uint32_t local_90;
  allocator<unsigned_int> local_8b;
  key_equal local_8a;
  hasher local_89;
  uint local_88 [26];
  iterator local_20;
  size_type local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_local;
  
  local_10 = s;
  if (is_reserved_word<std::__cxx11::string>(std::__cxx11::string_const&)::words == '\0') {
    iVar1 = __cxa_guard_acquire(&is_reserved_word<std::__cxx11::string>(std::__cxx11::string_const&)
                                 ::words);
    if (iVar1 != 0) {
      local_88[0x14] = 0xbbb1f5a7;
      local_88[0x15] = 0xfbf897bb;
      local_88[0x16] = 0x80fc2e47;
      local_88[0x17] = 0xc0a8fe33;
      local_88[0x10] = 0x8a25e7be;
      local_88[0x11] = 0x1dff06ae;
      local_88[0x12] = 0x833a0aae;
      local_88[0x13] = 0xda0c196e;
      local_88[0xc] = 0x4db211e5;
      local_88[0xd] = 0xb069958;
      local_88[0xe] = 0xab3e0bff;
      local_88[0xf] = 0x10a838b2;
      local_88[8] = 0x290c95cb;
      local_88[9] = 0x923fa396;
      local_88[10] = 0x85ee37bf;
      local_88[0xb] = 0xc9648178;
      local_88[4] = 0x39386e06;
      local_88[5] = 0xbdbf5bf0;
      local_88[6] = 0xabc12bed;
      local_88[7] = 0x5558edc5;
      local_88[0] = 0xc5597e8c;
      local_88[1] = 0xa8db785e;
      local_88[2] = 0xdc628ce;
      local_88[3] = 0xacf38390;
      local_20 = local_88;
      local_18 = 0x18;
      std::allocator<unsigned_int>::allocator(&local_8b);
      __l._M_len = local_18;
      __l._M_array = local_20;
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::unordered_set(&is_reserved_word<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::words,__l,0,&local_89,&local_8a,&local_8b);
      std::allocator<unsigned_int>::~allocator(&local_8b);
      __cxa_atexit(std::
                   unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::~unordered_set,
                   &is_reserved_word<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::words,&__dso_handle);
      __cxa_guard_release(&is_reserved_word<std::__cxx11::string>(std::__cxx11::string_const&)::
                           words);
    }
  }
  local_90 = utility::fnv1a::hash(local_10);
  sVar2 = std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::count(&is_reserved_word<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::words,&local_90);
  return sVar2 == 1;
}

Assistant:

static bool is_reserved_word(const T &s) noexcept {
      const static std::unordered_set<std::uint32_t>
          words{utility::hash("def"), utility::hash("fun"), utility::hash("while"), utility::hash("for"), utility::hash("if"), utility::hash("else"), utility::hash("&&"), utility::hash("||"), utility::hash(","), utility::hash("auto"), utility::hash("return"), utility::hash("break"), utility::hash("true"), utility::hash("false"), utility::hash("class"), utility::hash("attr"), utility::hash("var"), utility::hash("global"), utility::hash("GLOBAL"), utility::hash("_"), utility::hash("__LINE__"), utility::hash("__FILE__"), utility::hash("__FUNC__"), utility::hash("__CLASS__")};

      return words.count(utility::hash(s)) == 1;
    }